

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleUsage.cpp
# Opt level: O1

void readmeExample2(void)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  long *plVar4;
  uint uVar5;
  basic_ifstream<char,_std::char_traits<char>_> *stream;
  int iVar6;
  ifstream *this;
  uint uVar7;
  GeneratorBuilder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:225:26)>
  local_dd0 [2];
  ifstream local_dc0 [8];
  ifstream local_db8 [512];
  istream_type *local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined4 local_b98;
  char local_b94;
  ulong local_b90;
  ulong uStack_b88;
  ulong uStack_b80;
  undefined1 local_b78;
  Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>
  local_b70;
  ifstream local_918 [520];
  istream_type *local_710;
  undefined4 local_708;
  undefined1 local_704;
  istream_type *local_700;
  undefined4 local_6f8;
  char local_6f4;
  ulong local_6e8;
  ulong uStack_6e0;
  undefined1 local_6d8;
  undefined1 local_6b8 [520];
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_4b0;
  istream_type *local_4a0;
  undefined4 local_498;
  char local_494;
  ulong local_488;
  ulong uStack_480;
  undefined1 local_478;
  Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
  local_468;
  LazyCode local_238 [520];
  
  std::ifstream::ifstream(local_238,"test.txt",_S_in);
  LazyCode::read<int,std::ifstream>(&local_468,local_238,stream);
  local_dd0[0].build.n = (anon_class_8_1_54a3980e_for_build)10;
  LazyCode::
  operator|<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:225:26)>
            (&local_b70,&local_468,local_dd0);
  std::ifstream::ifstream(local_dc0,(ifstream *)&local_b70.member);
  local_bb8 = local_b70.member.member.first._M_stream;
  local_bb0._0_5_ =
       CONCAT14(local_b70.member.member.first._M_ok,local_b70.member.member.first._M_value);
  local_ba8 = local_b70.member.member.last._M_stream;
  local_ba0._0_5_ =
       CONCAT14(local_b70.member.member.last._M_ok,local_b70.member.member.last._M_value);
  local_b90 = local_b70.producer.count;
  uStack_b88 = local_b70.producer.n;
  this = local_918;
  std::ifstream::ifstream(this,local_dc0);
  local_710 = local_bb8;
  local_708 = (undefined4)local_bb0;
  local_704 = local_bb0._4_1_;
  local_700 = local_ba8;
  local_6f8 = (undefined4)local_ba0;
  local_6f4 = local_ba0._4_1_;
  local_6e8 = local_b90;
  uStack_6e0 = uStack_b88;
  std::ifstream::~ifstream(local_dc0);
  std::ifstream::ifstream(local_db8,this);
  local_bb0 = local_710;
  local_ba8._0_5_ = CONCAT14(local_704,local_708);
  local_ba0 = local_700;
  local_b98 = local_6f8;
  local_b94 = local_6f4;
  uStack_b88 = local_6e8;
  uStack_b80 = uStack_6e0;
  local_b78 = local_6d8;
  std::ifstream::ifstream(local_6b8,local_db8);
  local_4b0._M_stream = local_bb0;
  local_4b0._M_value = (uint)local_ba8;
  local_4b0._M_ok = (bool)local_ba8._4_1_;
  local_4a0 = local_ba0;
  local_498 = local_b98;
  local_494 = local_b94;
  local_488 = uStack_b88;
  uStack_480 = uStack_b80;
  local_478 = local_b78;
  std::ifstream::~ifstream(local_db8);
  uVar5 = 0;
  do {
    uVar7 = uVar5;
    uVar1 = local_488 + 1;
    if (local_488 < uStack_480) {
      if (local_4b0._M_ok == (bool)local_494) {
        bVar3 = false;
        uVar5 = 0;
        local_488 = uVar1;
        if (local_4b0._M_ok != false) {
          if (local_4b0._M_stream != local_4a0) goto LAB_00102743;
          uVar5 = 0;
          bVar3 = false;
        }
      }
      else {
LAB_00102743:
        local_488 = uVar1;
        std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read(&local_4b0);
        bVar3 = true;
        uVar5 = local_4b0._M_value;
      }
      uVar2 = (uint)this & 0xffffff00;
      if (bVar3) {
        uVar2 = uVar5;
      }
    }
    else {
      bVar3 = false;
      uVar2 = (uint)this & 0xffffff00;
      local_488 = uVar1;
    }
    this = (ifstream *)(ulong)uVar2;
    if ((!bVar3) || (uVar5 = uVar7, (uVar2 & 1) == 0)) {
      iVar6 = uVar2 * uVar2;
      if (!bVar3) {
        iVar6 = 0;
      }
      this = (ifstream *)(ulong)(iVar6 + uVar7);
      uVar5 = iVar6 + uVar7;
      if (!bVar3) {
        std::ifstream::~ifstream(local_6b8);
        std::ifstream::~ifstream(local_918);
        std::ifstream::~ifstream(&local_b70.member);
        std::ifstream::~ifstream(&local_468);
        std::ifstream::~ifstream(local_238);
        plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
        return;
      }
    }
  } while( true );
}

Assistant:

void readmeExample2() {
    int total = lz::read<int>(ifstream("test.txt")) | lz::limit(10) |
                lz::filter([](int i) { return i % 2 == 0; }) |
                lz::map([](int i) { return i * i; }) | lz::sum();

    cout << total << endl;
}